

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O3

int cgltf_parse_json_texture_view
              (jsmntok_t *tokens,int i,uint8_t *json_chunk,cgltf_texture_view *out_texture_view)

{
  jsmntok_t *pjVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  cgltf_texture_transform *out_array;
  int iVar7;
  uint uVar8;
  cgltf_float cVar9;
  
  if (tokens[(uint)i].type == JSMN_OBJECT) {
    out_texture_view->scale = 1.0;
    (out_texture_view->transform).scale[0] = 1.0;
    (out_texture_view->transform).scale[1] = 1.0;
    iVar2 = tokens[(uint)i].size;
    uVar8 = i + 1;
    if (0 < iVar2) {
      iVar7 = 0;
      do {
        if ((tokens[uVar8].type != JSMN_STRING) || (pjVar1 = tokens + uVar8, pjVar1->size == 0))
        goto LAB_003435e6;
        iVar3 = cgltf_json_strcmp(pjVar1,json_chunk,"index");
        if (iVar3 == 0) {
          iVar3 = cgltf_json_to_int(tokens + (long)(int)uVar8 + 1,json_chunk);
          out_texture_view->texture = (cgltf_texture *)((long)iVar3 + 1);
LAB_003433be:
          uVar8 = uVar8 + 2;
LAB_003433c2:
          if ((int)uVar8 < 0) {
            return uVar8;
          }
        }
        else {
          iVar3 = cgltf_json_strcmp(pjVar1,json_chunk,"texCoord");
          if (iVar3 == 0) {
            iVar3 = cgltf_json_to_int(tokens + (long)(int)uVar8 + 1,json_chunk);
            out_texture_view->texcoord = iVar3;
            goto LAB_003433be;
          }
          iVar3 = cgltf_json_strcmp(pjVar1,json_chunk,"scale");
          if ((iVar3 == 0) || (iVar3 = cgltf_json_strcmp(pjVar1,json_chunk,"strength"), iVar3 == 0))
          {
            cVar9 = cgltf_json_to_float(tokens + (long)(int)uVar8 + 1,json_chunk);
            out_texture_view->scale = cVar9;
            goto LAB_003433be;
          }
          iVar3 = cgltf_json_strcmp(pjVar1,json_chunk,"extras");
          if (iVar3 == 0) {
            (out_texture_view->extras).start_offset = (long)tokens[uVar8 + 1].start;
            (out_texture_view->extras).end_offset = (long)tokens[uVar8 + 1].end;
LAB_003433f7:
            uVar8 = cgltf_skip_json(tokens,uVar8 + 1);
            goto LAB_003433c2;
          }
          iVar3 = cgltf_json_strcmp(pjVar1,json_chunk,"extensions");
          if (iVar3 != 0) goto LAB_003433f7;
          if (tokens[(long)(int)uVar8 + 1].type != JSMN_OBJECT) goto LAB_003435e6;
          iVar3 = tokens[(long)(int)uVar8 + 1].size;
          uVar8 = uVar8 + 2;
          if (iVar3 < 1) goto LAB_003433c2;
          iVar4 = 0;
          do {
            if ((tokens[uVar8].type != JSMN_STRING) || (tokens[uVar8].size == 0)) goto LAB_003435e6;
            iVar5 = cgltf_json_strcmp(tokens + uVar8,json_chunk,"KHR_texture_transform");
            if (iVar5 == 0) {
              out_texture_view->has_transform = 1;
              if (tokens[(long)(int)uVar8 + 1].type != JSMN_OBJECT) goto LAB_003435e6;
              iVar5 = tokens[(long)(int)uVar8 + 1].size;
              uVar8 = uVar8 + 2;
              if (0 < iVar5) {
                do {
                  iVar5 = iVar5 + -1;
                  if ((tokens[uVar8].type != JSMN_STRING) ||
                     (pjVar1 = tokens + uVar8, pjVar1->size == 0)) goto LAB_003435e6;
                  iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"offset");
                  out_array = &out_texture_view->transform;
                  if (iVar6 == 0) {
LAB_00343596:
                    uVar8 = cgltf_parse_json_float_array
                                      (tokens,uVar8 + 1,json_chunk,out_array->offset,2);
                  }
                  else {
                    iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"rotation");
                    if (iVar6 == 0) {
                      cVar9 = cgltf_json_to_float(tokens + (long)(int)uVar8 + 1,json_chunk);
                      (out_texture_view->transform).rotation = cVar9;
LAB_003435c6:
                      uVar8 = uVar8 + 2;
                    }
                    else {
                      iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"scale");
                      out_array = (cgltf_texture_transform *)(out_texture_view->transform).scale;
                      if (iVar6 == 0) goto LAB_00343596;
                      iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"texCoord");
                      if (iVar6 == 0) {
                        iVar6 = cgltf_json_to_int(tokens + (long)(int)uVar8 + 1,json_chunk);
                        (out_texture_view->transform).texcoord = iVar6;
                        goto LAB_003435c6;
                      }
                      uVar8 = cgltf_skip_json(tokens,uVar8 + 1);
                    }
                  }
                } while ((-1 < (int)uVar8) && (iVar5 != 0));
              }
            }
            else {
              uVar8 = cgltf_skip_json(tokens,uVar8 + 1);
            }
            if ((int)uVar8 < 0) {
              return uVar8;
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 != iVar3);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar2);
    }
  }
  else {
LAB_003435e6:
    uVar8 = 0xffffffff;
  }
  return uVar8;
}

Assistant:

static int cgltf_parse_json_texture_view(jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_texture_view* out_texture_view)
{
    CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);

    out_texture_view->scale = 1.0f;
    cgltf_fill_float_array(out_texture_view->transform.scale, 2, 1.0f);

    int size = tokens[i].size;
    ++i;

    for (int j = 0; j < size; ++j)
    {
        CGLTF_CHECK_KEY(tokens[i]);

        if (cgltf_json_strcmp(tokens + i, json_chunk, "index") == 0)
        {
            ++i;
            out_texture_view->texture = CGLTF_PTRINDEX(cgltf_texture, cgltf_json_to_int(tokens + i, json_chunk));
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "texCoord") == 0)
        {
            ++i;
            out_texture_view->texcoord = cgltf_json_to_int(tokens + i, json_chunk);
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "scale") == 0)
        {
            ++i;
            out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "strength") == 0)
        {
            ++i;
            out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "extras") == 0)
        {
            i = cgltf_parse_json_extras(tokens, i + 1, json_chunk, &out_texture_view->extras);
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "extensions") == 0)
        {
            ++i;

            CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);

            int extensions_size = tokens[i].size;
            ++i;

            for (int k = 0; k < extensions_size; ++k)
            {
                CGLTF_CHECK_KEY(tokens[i]);

                if (cgltf_json_strcmp(tokens+i, json_chunk, "KHR_texture_transform") == 0)
                {
                    out_texture_view->has_transform = 1;
                    i = cgltf_parse_json_texture_transform(tokens, i + 1, json_chunk, &out_texture_view->transform);
                }
                else
                {
                    i = cgltf_skip_json(tokens, i+1);
                }

                if (i < 0)
                {
                    return i;
                }
            }
        }
        else
        {
            i = cgltf_skip_json(tokens, i + 1);
        }

        if (i < 0)
        {
            return i;
        }
    }

    return i;
}